

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

size_t SaveMultiChannelEXRToMemory(EXRImage *exrImage,uchar **memory_out,char **err)

{
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  uint uVar4;
  undefined8 uVar5;
  pointer puVar6;
  pointer paVar7;
  pointer paVar8;
  undefined4 uVar9;
  pointer pDest;
  size_t sVar10;
  _Alloc_hider _Var11;
  char *pcVar12;
  undefined8 *puVar13;
  int iVar14;
  uint uVar15;
  char cVar16;
  long lVar17;
  size_type sVar18;
  uchar *puVar19;
  pointer puVar20;
  uchar **data_00;
  long lVar21;
  ulong uVar22;
  int iVar23;
  int iVar24;
  unsigned_long uVar25;
  int iVar26;
  uint uVar27;
  float fVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  ushort uVar32;
  pointer paVar33;
  value_type *__val;
  long lVar34;
  int *piVar35;
  int iVar36;
  ulong uVar37;
  vector<unsigned_char,_std::allocator<unsigned_char>_> memory;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  char header [4];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  dataList;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channelOffsetList;
  vector<long_long,_std::allocator<long_long>_> offsets;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  int local_1b8;
  int local_1b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_188;
  value_type local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_130;
  int local_114;
  long local_110;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_108;
  pointer local_e8;
  pointer local_e0;
  pointer local_d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  ulong local_b8;
  size_type local_b0;
  uchar *local_a8;
  vector<long_long,_std::allocator<long_long>_> local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  long local_68;
  uchar **local_60;
  size_type local_58;
  long local_50;
  size_type local_48;
  int *local_40;
  pointer local_38;
  
  if (exrImage == (EXRImage *)0x0 || memory_out == (uchar **)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.";
    }
    return 0xffffffffffffffff;
  }
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uchar *)0x0;
  local_168.name._M_dataplus._M_p._0_4_ = 3.2543817e-38;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,0,&local_168);
  local_168.name._M_dataplus._M_p._0_4_ = 2.8026e-45;
  local_60 = memory_out;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<char_const*>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,
             local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,&local_168);
  local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_108.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < exrImage->num_channels) {
    paVar2 = &local_168.name.field_2;
    lVar34 = 0;
    do {
      local_168.name._M_string_length = 0;
      local_168.name.field_2._M_local_buf[0] = '\0';
      local_168.pLinear = '\0';
      local_168.pixelType = exrImage->requested_pixel_types[lVar34];
      local_168.xSampling = 1;
      local_168.ySampling = 1;
      local_168.name._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,exrImage->channel_names[lVar34],(allocator<char> *)&local_d0);
      std::__cxx11::string::operator=((string *)&local_168,(string *)&local_a0);
      if ((pointer *)
          local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::push_back(&local_108,&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168.name._M_dataplus._M_p != paVar2) {
        operator_delete(local_168.name._M_dataplus._M_p,
                        CONCAT71(local_168.name.field_2._M_allocated_capacity._1_7_,
                                 local_168.name.field_2._M_local_buf[0]) + 1);
      }
      lVar34 = lVar34 + 1;
    } while (lVar34 < exrImage->num_channels);
  }
  paVar8 = local_108.
           super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar7 = local_108.
           super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_108.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_108.
            super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
            ._M_impl.super__Vector_impl_data._M_start == 0) {
    sVar18 = 1;
  }
  else {
    lVar21 = ((long)local_108.
                    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_108.
                    super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
    lVar21 = lVar21 + (ulong)(lVar21 == 0);
    lVar34 = 0;
    paVar33 = local_108.
              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      sVar10 = strlen((paVar33->name)._M_dataplus._M_p);
      lVar17 = lVar34 + sVar10;
      lVar34 = lVar17 + 0x11;
      paVar33 = paVar33 + 1;
      lVar21 = lVar21 + -1;
    } while (lVar21 != 0);
    sVar18 = lVar17 + 0x12;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_188,sVar18);
  if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar34 = 0;
LAB_00162803:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,lVar34)
    ;
  }
  else {
    lVar34 = (long)paVar8 - (long)paVar7;
    puVar20 = local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (lVar34 != 0) {
      lVar34 = (lVar34 >> 4) * -0x5555555555555555;
      lVar34 = lVar34 + (ulong)(lVar34 == 0);
      piVar35 = &paVar7->ySampling;
      do {
        pcVar12 = (((anon_struct_48_5_91bcb76e *)(piVar35 + -0xb))->name)._M_dataplus._M_p;
        sVar10 = strlen(pcVar12);
        memcpy(puVar20,pcVar12,sVar10);
        sVar10 = strlen((((anon_struct_48_5_91bcb76e *)(piVar35 + -0xb))->name)._M_dataplus._M_p);
        puVar19 = puVar20 + sVar10;
        puVar20 = puVar19 + 0x11;
        *puVar19 = '\0';
        uVar5 = *(undefined8 *)(piVar35 + -1);
        *(int *)(puVar19 + 1) = piVar35[-3];
        puVar19[5] = *(uchar *)(piVar35 + -2);
        *(undefined8 *)(puVar19 + 9) = uVar5;
        piVar35 = piVar35 + 0xc;
        lVar34 = lVar34 + -1;
      } while (lVar34 != 0);
    }
    *puVar20 = '\0';
    lVar34 = (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    if (lVar34 == 0) goto LAB_00162803;
    anon_unknown.dwarf_57b15::WriteAttributeToMemory
              (&local_1a8,"channels","chlist",
               local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,(int)lVar34);
    std::
    vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
    ::~vector(&local_108);
    if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uchar *)0x0) {
      operator_delete(local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_188.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_188.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    local_168.name._M_dataplus._M_p._0_4_ = 4.2039e-45;
    anon_unknown.dwarf_57b15::WriteAttributeToMemory
              (&local_1a8,"compression","compression",(uchar *)&local_168,1);
    local_168.name._M_dataplus._M_p = (pointer)0x0;
    local_168.name._M_string_length = CONCAT44(exrImage->height + -1,exrImage->width + -1);
    anon_unknown.dwarf_57b15::WriteAttributeToMemory
              (&local_1a8,"dataWindow","box2i",(uchar *)&local_168,0x10);
    anon_unknown.dwarf_57b15::WriteAttributeToMemory
              (&local_1a8,"displayWindow","box2i",(uchar *)&local_168,0x10);
    local_168.name._M_dataplus._M_p = local_168.name._M_dataplus._M_p & 0xffffffffffffff00;
    anon_unknown.dwarf_57b15::WriteAttributeToMemory
              (&local_1a8,"lineOrder","lineOrder",(uchar *)&local_168,1);
    local_168.name._M_dataplus._M_p._0_4_ = 1.0;
    anon_unknown.dwarf_57b15::WriteAttributeToMemory
              (&local_1a8,"pixelAspectRatio","float",(uchar *)&local_168,4);
    local_168.name._M_dataplus._M_p = (pointer)0x0;
    anon_unknown.dwarf_57b15::WriteAttributeToMemory
              (&local_1a8,"screenWindowCenter","v2f",(uchar *)&local_168,8);
    local_168.name._M_dataplus._M_p._0_4_ = (float)exrImage->width;
    anon_unknown.dwarf_57b15::WriteAttributeToMemory
              (&local_1a8,"screenWindowWidth","float",(uchar *)&local_168,4);
    if ((0 < exrImage->num_custom_attributes) &&
       (puts("custom"), 0 < exrImage->num_custom_attributes)) {
      data_00 = &exrImage->custom_attributes[0].value;
      lVar34 = 0;
      do {
        anon_unknown.dwarf_57b15::WriteAttributeToMemory
                  (&local_1a8,((EXRAttribute *)(data_00 + -3))->name,(char *)data_00[-2],
                   (uchar *)data_00,*(int *)(data_00 + -1));
        lVar34 = lVar34 + 1;
        data_00 = data_00 + 4;
      } while (lVar34 < exrImage->num_custom_attributes);
    }
    local_168.name._M_dataplus._M_p = local_168.name._M_dataplus._M_p & 0xffffffffffffff00;
    if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,
                 (iterator)
                 local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,(uchar *)&local_168);
    }
    else {
      *local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish = '\0';
      local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    uVar4 = exrImage->height;
    uVar30 = uVar4 + 0xf;
    if (-1 < (int)uVar4) {
      uVar30 = uVar4;
    }
    local_114 = (uint)((int)(uVar30 & 0xfffffff0) < (int)uVar4) + ((int)uVar30 >> 4);
    sVar18 = (size_type)local_114;
    std::vector<long_long,_std::allocator<long_long>_>::vector
              (&local_a0,sVar18,(allocator_type *)&local_168);
    lVar34 = sVar18 * 8;
    local_a8 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               (lVar34 - (long)local_1a8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (uchar *)0x0;
    local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0 = sVar18;
    std::
    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              *)&local_108,sVar18,(allocator_type *)&local_168);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_d0,(long)exrImage->num_channels,(allocator_type *)&local_168);
    iVar24 = exrImage->num_channels;
    local_68 = lVar34;
    if ((long)iVar24 < 1) {
      local_1b8 = 0;
    }
    else {
      piVar35 = exrImage->requested_pixel_types;
      lVar34 = 0;
      local_1b8 = 0;
      uVar25 = 0;
      do {
        local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar34] = uVar25;
        uVar37 = (ulong)(uint)piVar35[lVar34];
        if (2 < uVar37) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                        ,0x26f0,
                        "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                       );
        }
        local_1b8 = local_1b8 + *(int *)(&DAT_001a50e8 + uVar37 * 4);
        uVar25 = uVar25 + *(long *)(&DAT_001a50d0 + uVar37 * 8);
        lVar34 = lVar34 + 1;
      } while (iVar24 != lVar34);
    }
    if (0 < local_114) {
      local_1b0 = 0;
      local_58 = 0;
      do {
        local_50 = local_58 << 4;
        iVar24 = exrImage->height;
        iVar23 = (int)(local_58 + 1);
        iVar14 = iVar23 * 0x10;
        if (SBORROW4(iVar24,iVar14) != iVar24 + iVar23 * -0x10 < 0) {
          iVar14 = iVar24;
        }
        iVar14 = iVar14 - (int)local_50;
        local_48 = local_58;
        local_58 = local_58 + 1;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_130,(long)(iVar14 * local_1b8 * exrImage->width),
                   (allocator_type *)&local_168);
        if (0 < exrImage->num_channels) {
          local_40 = exrImage->pixel_types;
          local_110 = (long)iVar14;
          lVar34 = 0;
          do {
            iVar24 = local_40[lVar34];
            if (iVar24 == 2) {
              if (exrImage->requested_pixel_types[lVar34] == 1) {
                if (0 < iVar14) {
                  uVar4 = exrImage->width;
                  local_e0 = local_d0.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  local_e8 = (pointer)(long)(int)uVar4;
                  local_38 = local_130.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  uVar30 = local_1b0 * uVar4;
                  iVar24 = 0;
                  lVar21 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar25 = local_d0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar34];
                      puVar19 = exrImage->images[lVar34];
                      uVar37 = 0;
                      local_d8 = (pointer)CONCAT44(local_d8._4_4_,uVar30);
                      do {
                        uVar27 = *(uint *)(puVar19 + uVar37 * 4 + (ulong)uVar30 * 4);
                        uVar15 = uVar27 >> 0x17;
                        uVar29 = uVar15 & 0xff;
                        uVar32 = (ushort)uVar29;
                        if ((char)uVar15 != '\0') {
                          if (uVar29 == 0xff) {
                            uVar32 = ((uVar27 & 0x7fffff) != 0 | 0x3e) << 9;
                          }
                          else {
                            uVar32 = 0x7c00;
                            if (uVar29 < 0x8f) {
                              if (uVar29 < 0x71) {
                                uVar32 = 0;
                                if (uVar29 < 0x66) goto LAB_00162280;
                                uVar31 = uVar27 & 0x7fffff | 0x800000;
                                uVar32 = (ushort)(uVar31 >> (0x7eU - (char)uVar15 & 0x1f)) & 0x3ff;
                                uVar31 = uVar31 >> (0x7d - uVar29 & 0x1f);
                              }
                              else {
                                uVar32 = ((ushort)(uVar27 >> 0xd) & 0x3ff |
                                         (ushort)((uVar15 & 0x1f) << 10)) ^ 0x4000;
                                uVar31 = uVar27 >> 0xc;
                              }
                              uVar32 = uVar32 + ((uVar31 & 1) != 0);
                            }
LAB_00162280:
                            uVar32 = uVar32 & 0x7fff;
                          }
                        }
                        if ((ulong)((long)local_130.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_130.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) <=
                            (long)(int)(uVar4 * local_1b8 * (int)lVar21) + uVar25 * (long)local_e8)
                        goto LAB_00162700;
                        *(ushort *)
                         (local_130.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar37 * 2 + uVar25 * (long)local_e8 + (long)iVar24) =
                             uVar32 | (ushort)(uVar27 >> 0x10) & 0x8000;
                        uVar37 = uVar37 + 1;
                      } while (uVar4 != uVar37);
                    }
                    lVar21 = lVar21 + 1;
                    uVar30 = uVar30 + uVar4;
                    iVar24 = iVar24 + uVar4 * local_1b8;
                  } while (lVar21 < local_110);
                }
              }
              else {
                if (exrImage->requested_pixel_types[lVar34] != 2) goto LAB_00162738;
                if (0 < iVar14) {
                  uVar4 = exrImage->width;
                  uVar30 = local_1b0 * uVar4;
                  iVar24 = 0;
                  lVar21 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar25 = local_d0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar34];
                      if ((ulong)((long)local_130.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_130.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) <=
                          (long)(int)(uVar4 * local_1b8 * (int)lVar21) + uVar25 * (long)(int)uVar4)
                      goto LAB_0016271c;
                      puVar19 = exrImage->images[lVar34];
                      uVar37 = 0;
                      do {
                        *(undefined4 *)
                         (local_130.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar37 * 4 + uVar25 * (long)(int)uVar4 + (long)iVar24) =
                             *(undefined4 *)(puVar19 + uVar37 * 4 + (ulong)uVar30 * 4);
                        uVar37 = uVar37 + 1;
                      } while (uVar4 != uVar37);
                    }
                    lVar21 = lVar21 + 1;
                    uVar30 = uVar30 + uVar4;
                    iVar24 = iVar24 + uVar4 * local_1b8;
                  } while (lVar21 < local_110);
                }
              }
            }
            else if (iVar24 == 1) {
              if (exrImage->requested_pixel_types[lVar34] == 2) {
                if (0 < iVar14) {
                  uVar4 = exrImage->width;
                  local_d8 = local_d0.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  local_e0 = (pointer)(long)(int)uVar4;
                  local_e8 = local_130.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                  uVar30 = local_1b0 * uVar4;
                  iVar24 = 0;
                  lVar21 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar25 = local_d0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar34];
                      puVar19 = exrImage->images[lVar34];
                      uVar37 = 0;
                      do {
                        uVar27 = (uint)*(ushort *)(puVar19 + uVar37 * 2 + (ulong)uVar30 * 2) << 0xd;
                        if ((uVar27 & 0xf800000) == 0xf800000) {
                          fVar28 = (float)(uVar27 | 0x70000000);
                        }
                        else if ((uVar27 & 0xf800000) == 0) {
                          fVar28 = (float)(uVar27 | 0x38800000) + -6.1035156e-05;
                        }
                        else {
                          fVar28 = (float)((uVar27 & 0xfffe000) + 0x38000000);
                        }
                        if ((ulong)((long)local_130.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_130.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start) <=
                            (long)(int)(uVar4 * local_1b8 * (int)lVar21) + uVar25 * (long)local_e0)
                        goto LAB_0016270e;
                        *(uint *)(local_130.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start +
                                 uVar37 * 4 + uVar25 * (long)local_e0 + (long)iVar24) =
                             (uint)fVar28 |
                             (int)(short)*(ushort *)(puVar19 + uVar37 * 2 + (ulong)uVar30 * 2) &
                             0x80000000U;
                        uVar37 = uVar37 + 1;
                      } while (uVar4 != uVar37);
                    }
                    lVar21 = lVar21 + 1;
                    uVar30 = uVar30 + uVar4;
                    iVar24 = iVar24 + uVar4 * local_1b8;
                  } while (lVar21 < local_110);
                }
              }
              else {
                if (exrImage->requested_pixel_types[lVar34] != 1) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                                ,0x2728,
                                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
                               );
                }
                if (0 < iVar14) {
                  uVar4 = exrImage->width;
                  uVar30 = local_1b0 * uVar4;
                  iVar24 = 0;
                  lVar21 = 0;
                  do {
                    if (0 < (int)uVar4) {
                      uVar25 = local_d0.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar34];
                      if ((ulong)((long)local_130.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_130.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start) <=
                          (long)(int)(uVar4 * local_1b8 * (int)lVar21) + uVar25 * (long)(int)uVar4)
                      goto LAB_0016272a;
                      puVar19 = exrImage->images[lVar34];
                      uVar37 = 0;
                      do {
                        *(undefined2 *)
                         (local_130.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start +
                         uVar37 * 2 + uVar25 * (long)(int)uVar4 + (long)iVar24) =
                             *(undefined2 *)(puVar19 + uVar37 * 2 + (ulong)uVar30 * 2);
                        uVar37 = uVar37 + 1;
                      } while (uVar4 != uVar37);
                    }
                    lVar21 = lVar21 + 1;
                    uVar30 = uVar30 + uVar4;
                    iVar24 = iVar24 + uVar4 * local_1b8;
                  } while (lVar21 < local_110);
                }
              }
            }
            else if ((iVar24 == 0) && (0 < iVar14)) {
              iVar23 = 0;
              iVar26 = 0;
              iVar24 = local_1b0;
              do {
                uVar37 = (ulong)(uint)exrImage->width;
                if (0 < exrImage->width) {
                  uVar25 = local_d0.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start[lVar34];
                  lVar21 = 0;
                  do {
                    iVar36 = (int)uVar37;
                    if ((ulong)((long)local_130.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_130.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) <=
                        (long)(iVar26 * local_1b8 * iVar36) + (long)iVar36 * uVar25) {
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
LAB_00162700:
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
LAB_0016270e:
                      std::__throw_out_of_range_fmt
                                (
                                "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                );
                      goto LAB_0016271c;
                    }
                    *(undefined4 *)
                     (local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                     lVar21 * 4 + (long)iVar36 * uVar25 + (long)(iVar36 * iVar23)) =
                         *(undefined4 *)
                          (exrImage->images[lVar34] + (long)(iVar24 * iVar36 + (int)lVar21) * 4);
                    lVar21 = lVar21 + 1;
                    uVar37 = (ulong)exrImage->width;
                  } while (lVar21 < (long)uVar37);
                }
                iVar26 = iVar26 + 1;
                iVar24 = iVar24 + 1;
                iVar23 = iVar23 + local_1b8;
              } while (iVar26 < iVar14);
            }
            lVar34 = lVar34 + 1;
          } while (lVar34 < exrImage->num_channels);
        }
        uVar22 = (long)local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        uVar37 = (uVar22 * 0x6e) / 100 + 0x80;
        uVar22 = uVar22 + (uVar22 / 0x7c00) * 5 + 0x85;
        if (uVar22 < uVar37) {
          uVar22 = uVar37;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_80,uVar22,(allocator_type *)&local_168);
        pDest = local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
        puVar6 = local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        puVar20 = local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          sVar18 = 0;
LAB_00162798:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,
                     sVar18);
LAB_001627ab:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_001627bd:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_001627cf:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
LAB_001627e1:
          __assert_fail("ret == miniz::MZ_OK",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                        ,0x1bc6,
                        "void (anonymous namespace)::CompressZip(unsigned char *, unsigned long long &, const unsigned char *, unsigned long)"
                       );
        }
        sVar18 = (long)local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start;
        if (sVar18 == 0) goto LAB_00162798;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_168,sVar18,
                   (allocator_type *)&local_b8);
        if ((pointer)local_168.name._M_string_length == local_168.name._M_dataplus._M_p)
        goto LAB_001627ab;
        if (0 < (long)sVar18) {
          _Var11._M_p = local_168.name._M_dataplus._M_p;
          do {
            *_Var11._M_p = *puVar20;
            if (puVar6 <= puVar20 + 1) break;
            _Var11._M_p[sVar18 + 1 >> 1] = puVar20[1];
            _Var11._M_p = _Var11._M_p + 1;
            puVar20 = puVar20 + 2;
          } while (puVar20 < puVar6);
        }
        if ((pointer)local_168.name._M_string_length == local_168.name._M_dataplus._M_p)
        goto LAB_001627bd;
        if (1 < (long)sVar18) {
          pcVar12 = local_168.name._M_dataplus._M_p + 1;
          cVar16 = *local_168.name._M_dataplus._M_p;
          do {
            cVar3 = *pcVar12;
            *pcVar12 = (cVar3 - cVar16) + -0x80;
            pcVar12 = pcVar12 + 1;
            cVar16 = cVar3;
          } while (pcVar12 < local_168.name._M_dataplus._M_p + sVar18);
        }
        local_b8 = (sVar18 * 0x6e) / 100 + 0x80;
        uVar37 = (sVar18 / 0x7c00) * 5 + sVar18 + 0x85;
        if (local_b8 <= uVar37) {
          local_b8 = uVar37;
        }
        if ((pointer)local_168.name._M_string_length == local_168.name._M_dataplus._M_p)
        goto LAB_001627cf;
        iVar24 = mz_compress2(pDest,&local_b8,(uchar *)local_168.name._M_dataplus._M_p,sVar18,-1);
        if (iVar24 != 0) goto LAB_001627e1;
        uVar9 = (undefined4)local_b8;
        uVar37 = local_b8 & 0xffffffff;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168.name._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_168.name._M_dataplus._M_p,
                          CONCAT71(local_168.name.field_2._M_allocated_capacity._1_7_,
                                   local_168.name.field_2._M_local_buf[0]) -
                          (long)local_168.name._M_dataplus._M_p);
        }
        puVar13 = (undefined8 *)operator_new(8);
        sVar18 = local_48;
        *puVar13 = 0;
        *(int *)puVar13 = (int)local_50;
        *(undefined4 *)((long)puVar13 + 4) = uVar9;
        pvVar1 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                 (&((local_108.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus + local_48 * 3);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar1,*(undefined8 *)(pvVar1 + 8),puVar13,puVar13 + 1);
        pvVar1 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                 (&((local_108.
                     super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus + sVar18 * 3);
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  (pvVar1,*(undefined8 *)(pvVar1 + 8),
                   local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar37);
        operator_delete(puVar13,8);
        if (local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_80.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_80.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_80.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_130.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_130.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_130.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_130.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_1b0 = local_1b0 + 0x10;
      } while (local_58 != local_b0);
    }
    if (0 < local_114) {
      lVar34 = 1;
      sVar18 = 0;
      do {
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_188,
                   local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   *(undefined8 *)
                    ((long)local_108.
                           super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar34 * 8 + -8),
                   (&((local_108.
                       super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)[lVar34]._M_p);
        local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar18] = (longlong)local_a8;
        local_a8 = local_a8 +
                   ((long)(&((local_108.
                              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus)[lVar34]
                          ._M_p -
                   *(long *)((long)local_108.
                                   super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar34 * 8 + -8));
        sVar18 = sVar18 + 1;
        lVar34 = lVar34 + 3;
      } while (local_b0 != sVar18);
    }
    if (local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::_M_range_insert<unsigned_char*>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,
                 local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (undefined1 *)
                 (local_68 +
                 (long)local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start));
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a8,
                 local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish,
                 local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start,
                 local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_finish);
      puVar20 = local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
      sVar10 = (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if (sVar10 != 0) {
        puVar19 = (uchar *)malloc(sVar10);
        *local_60 = puVar19;
        memcpy(puVar19,puVar20,sVar10);
        if (local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        std::
        vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   *)&local_108);
        if (local_188.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_188.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_188.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_188.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (pointer)0x0) {
          return sVar10;
        }
        operator_delete(local_1a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_1a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1a8.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        return sVar10;
      }
      goto LAB_00162828;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
LAB_00162828:
  __assert_fail("memory.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                ,0x27a2,
                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
               );
LAB_0016271c:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_0016272a:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00162738:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cyang2020[P]Rasterizer/CGL/include/CGL/tinyexr.h"
                ,0x2755,
                "size_t SaveMultiChannelEXRToMemory(const EXRImage *, unsigned char **, const char **)"
               );
}

Assistant:

size_t SaveMultiChannelEXRToMemory(const EXRImage *exrImage,
                                   unsigned char **memory_out,
                                   const char **err) {
  if (exrImage == NULL || memory_out == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  std::vector<unsigned char> memory;

  // Header
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};
    memory.insert(memory.end(), header, header + 4);
  }

  // Version, scanline.
  {
    const char marker[] = {2, 0, 0, 0};
    memory.insert(memory.end(), marker, marker + 4);
  }

  int numScanlineBlocks =
      16; // 1 for no compress & ZIPS, 16 for ZIP compression.

  // Write attributes.
  {
    std::vector<unsigned char> data;

    std::vector<ChannelInfo> channels;
    for (int c = 0; c < exrImage->num_channels; c++) {
      ChannelInfo info;
      info.pLinear = 0;
      info.pixelType = exrImage->requested_pixel_types[c];
      info.xSampling = 1;
      info.ySampling = 1;
      info.name = std::string(exrImage->channel_names[c]);
      channels.push_back(info);
    }

    WriteChannelInfo(data, channels);

    WriteAttributeToMemory(memory, "channels", "chlist", &data.at(0),
                           data.size()); // +1 = null
  }

  {
    int compressionType = 3; // ZIP compression
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&compressionType));
    }
    WriteAttributeToMemory(
        memory, "compression", "compression",
        reinterpret_cast<const unsigned char *>(&compressionType), 1);
  }

  {
    int data[4] = {0, 0, exrImage->width - 1, exrImage->height - 1};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&data[0]));
      swap4(reinterpret_cast<unsigned int *>(&data[1]));
      swap4(reinterpret_cast<unsigned int *>(&data[2]));
      swap4(reinterpret_cast<unsigned int *>(&data[3]));
    }
    WriteAttributeToMemory(memory, "dataWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
    WriteAttributeToMemory(memory, "displayWindow", "box2i",
                           reinterpret_cast<const unsigned char *>(data),
                           sizeof(int) * 4);
  }

  {
    unsigned char lineOrder = 0; // increasingY
    WriteAttributeToMemory(memory, "lineOrder", "lineOrder", &lineOrder, 1);
  }

  {
    float aspectRatio = 1.0f;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&aspectRatio));
    }
    WriteAttributeToMemory(
        memory, "pixelAspectRatio", "float",
        reinterpret_cast<const unsigned char *>(&aspectRatio), sizeof(float));
  }

  {
    float center[2] = {0.0f, 0.0f};
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&center[0]));
      swap4(reinterpret_cast<unsigned int *>(&center[1]));
    }
    WriteAttributeToMemory(memory, "screenWindowCenter", "v2f",
                           reinterpret_cast<const unsigned char *>(center),
                           2 * sizeof(float));
  }

  {
    float w = (float)exrImage->width;
    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&w));
    }
    WriteAttributeToMemory(memory, "screenWindowWidth", "float",
                           reinterpret_cast<const unsigned char *>(&w),
                           sizeof(float));
  }

  // Custom attributes
  if (exrImage->num_custom_attributes > 0) {
    printf("custom\n");
    // @todo { endian }
    for (int i = 0; i < exrImage->num_custom_attributes; i++) {
      WriteAttributeToMemory(memory, exrImage->custom_attributes[i].name, exrImage->custom_attributes[i].type,
                             reinterpret_cast<const unsigned char *>(&exrImage->custom_attributes[i].value),
                             exrImage->custom_attributes[i].size);
        
    }
  }

  { // end of header
    unsigned char e = 0;
    memory.push_back(e);
  }

  int numBlocks = exrImage->height / numScanlineBlocks;
  if (numBlocks * numScanlineBlocks < exrImage->height) {
    numBlocks++;
  }

  std::vector<long long> offsets(numBlocks);

  size_t headerSize = memory.size();
  long long offset =
      headerSize +
      numBlocks * sizeof(long long); // sizeof(header) + sizeof(offsetTable)

  std::vector<unsigned char> data;

  bool isBigEndian = IsBigEndian();

  std::vector<std::vector<unsigned char> > dataList(numBlocks);
  std::vector<size_t> channelOffsetList(exrImage->num_channels);

  int pixelDataSize = 0;
  size_t channelOffset = 0;
  for (int c = 0; c < exrImage->num_channels; c++) {
    channelOffsetList[c] = channelOffset;
    if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
      pixelDataSize += sizeof(unsigned short);
      channelOffset += sizeof(unsigned short);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
      pixelDataSize += sizeof(float);
      channelOffset += sizeof(float);
    } else if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {
      pixelDataSize += sizeof(unsigned int);
      channelOffset += sizeof(unsigned int);
    } else {
      assert(0);
    }
  }

#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (int i = 0; i < numBlocks; i++) {
    int startY = numScanlineBlocks * i;
    int endY = (std::min)(numScanlineBlocks * (i + 1), exrImage->height);
    int h = endY - startY;

    std::vector<unsigned char> buf(exrImage->width * h * pixelDataSize);

    for (int c = 0; c < exrImage->num_channels; c++) {
      if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP16 h16;
              h16.u = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP32 f32 = half_to_float(h16);

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&f32.f));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = f32.f;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              unsigned short val = reinterpret_cast<unsigned short **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap2(&val);
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }

      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_FLOAT) {

        if (exrImage->requested_pixel_types[c] == TINYEXR_PIXELTYPE_HALF) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              FP32 f32;
              f32.f = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              FP16 h16;
              h16 = float_to_half_full(f32);

              if (isBigEndian) {
                swap2(reinterpret_cast<unsigned short *>(&h16.u));
              }

              // Assume increasing Y
              unsigned short *linePtr = reinterpret_cast<unsigned short *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = h16.u;
            }
          }
        } else if (exrImage->requested_pixel_types[c] ==
                   TINYEXR_PIXELTYPE_FLOAT) {
          for (int y = 0; y < h; y++) {
            for (int x = 0; x < exrImage->width; x++) {
              float val = reinterpret_cast<float **>(
                  exrImage->images)[c][(y + startY) * exrImage->width + x];

              if (isBigEndian) {
                swap4(reinterpret_cast<unsigned int *>(&val));
              }

              // Assume increasing Y
              float *linePtr = reinterpret_cast<float *>(
                  &buf.at(pixelDataSize * y * exrImage->width +
                          channelOffsetList[c] * exrImage->width));
              linePtr[x] = val;
            }
          }
        } else {
          assert(0);
        }
      } else if (exrImage->pixel_types[c] == TINYEXR_PIXELTYPE_UINT) {

        for (int y = 0; y < h; y++) {
          for (int x = 0; x < exrImage->width; x++) {
            unsigned int val = reinterpret_cast<unsigned int **>(
                exrImage->images)[c][(y + startY) * exrImage->width + x];

            if (isBigEndian) {
              swap4(&val);
            }

            // Assume increasing Y
            unsigned int *linePtr = reinterpret_cast<unsigned int *>(
                &buf.at(pixelDataSize * y * exrImage->width +
                        channelOffsetList[c] * exrImage->width));
            linePtr[x] = val;
          }
        }
      }
    }

    std::vector<unsigned char> block(miniz::mz_compressBound(buf.size()));
    unsigned long long outSize = block.size();

    CompressZip(&block.at(0), outSize,
                reinterpret_cast<const unsigned char *>(&buf.at(0)),
                buf.size());

    // 4 byte: scan line
    // 4 byte: data size
    // ~     : pixel data(compressed)
    std::vector<unsigned char> header(8);
    unsigned int dataLen = outSize; // truncate
    memcpy(&header.at(0), &startY, sizeof(int));
    memcpy(&header.at(4), &dataLen, sizeof(unsigned int));

    if (IsBigEndian()) {
      swap4(reinterpret_cast<unsigned int *>(&header.at(0)));
      swap4(reinterpret_cast<unsigned int *>(&header.at(4)));
    }

    dataList[i].insert(dataList[i].end(), header.begin(), header.end());
    dataList[i].insert(dataList[i].end(), block.begin(),
                       block.begin() + dataLen);

    // data.insert(data.end(), header.begin(), header.end());
    // data.insert(data.end(), block.begin(), block.begin() + dataLen);

    // offsets[i] = offset;
    // if (IsBigEndian()) {
    //  swap8(reinterpret_cast<unsigned long long*>(&offsets[i]));
    //}
    // offset += dataLen + 8; // 8 = sizeof(blockHeader)
  } // omp parallel

  for (int i = 0; i < numBlocks; i++) {

    data.insert(data.end(), dataList[i].begin(), dataList[i].end());

    offsets[i] = offset;
    if (IsBigEndian()) {
      swap8(reinterpret_cast<unsigned long long *>(&offsets[i]));
    }
    offset += dataList[i].size();
  }

  {
    memory.insert(memory.end(),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)),
                  reinterpret_cast<unsigned char *>(&offsets.at(0)) +
                      sizeof(unsigned long long) * numBlocks);
  }

  { memory.insert(memory.end(), data.begin(), data.end()); }

  assert(memory.size() > 0);

  (*memory_out) = (unsigned char *)malloc(memory.size());
  memcpy((*memory_out), &memory.at(0), memory.size());

  return memory.size(); // OK
}